

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O1

void __thiscall JSONUTF8StringFilter::append_codepoint(JSONUTF8StringFilter *this,uint codepoint_)

{
  long lVar1;
  byte bVar2;
  string *psVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (codepoint_ < 0x80) {
    psVar3 = this->str;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
LAB_00112e84:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (psVar3,(char)codepoint_);
      return;
    }
  }
  else {
    if (codepoint_ < 0x800) {
      psVar3 = this->str;
      bVar2 = (byte)(codepoint_ >> 6) | 0xc0;
    }
    else {
      if (codepoint_ < 0x10000) {
        psVar3 = this->str;
        bVar2 = (byte)(codepoint_ >> 0xc) | 0xe0;
      }
      else {
        if (0x1fffff < codepoint_) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return;
          }
          goto LAB_00112eaa;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->str,(byte)(codepoint_ >> 0x12) | 0xf0);
        psVar3 = this->str;
        bVar2 = (byte)(codepoint_ >> 0xc) & 0x3f | 0x80;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (psVar3,bVar2);
      psVar3 = this->str;
      bVar2 = (byte)(codepoint_ >> 6) & 0x3f | 0x80;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (psVar3,bVar2);
    psVar3 = this->str;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      codepoint_ = (uint)((byte)codepoint_ & 0x3f | 0x80);
      goto LAB_00112e84;
    }
  }
LAB_00112eaa:
  __stack_chk_fail();
}

Assistant:

void append_codepoint(unsigned int codepoint_)
    {
        if (codepoint_ <= 0x7f)
            str.push_back((char)codepoint_);
        else if (codepoint_ <= 0x7FF) {
            str.push_back((char)(0xC0 | (codepoint_ >> 6)));
            str.push_back((char)(0x80 | (codepoint_ & 0x3F)));
        } else if (codepoint_ <= 0xFFFF) {
            str.push_back((char)(0xE0 | (codepoint_ >> 12)));
            str.push_back((char)(0x80 | ((codepoint_ >> 6) & 0x3F)));
            str.push_back((char)(0x80 | (codepoint_ & 0x3F)));
        } else if (codepoint_ <= 0x1FFFFF) {
            str.push_back((char)(0xF0 | (codepoint_ >> 18)));
            str.push_back((char)(0x80 | ((codepoint_ >> 12) & 0x3F)));
            str.push_back((char)(0x80 | ((codepoint_ >> 6) & 0x3F)));
            str.push_back((char)(0x80 | (codepoint_ & 0x3F)));
        }
    }